

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_common.h
# Opt level: O2

void set_segment_id(uint8_t *segment_ids,int mi_offset,int x_mis,int y_mis,int mi_stride,
                   uint8_t segment_id)

{
  uint8_t *__s;
  ulong uVar1;
  bool bVar2;
  
  __s = segment_ids + mi_offset;
  uVar1 = 0;
  if (0 < y_mis) {
    uVar1 = (ulong)(uint)y_mis;
  }
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    memset(__s,(uint)segment_id,(long)x_mis);
    __s = __s + mi_stride;
  }
  return;
}

Assistant:

static inline void set_segment_id(uint8_t *segment_ids, int mi_offset,
                                  int x_mis, int y_mis, int mi_stride,
                                  uint8_t segment_id) {
  segment_ids += mi_offset;
  for (int y = 0; y < y_mis; ++y) {
    memset(&segment_ids[y * mi_stride], segment_id,
           x_mis * sizeof(segment_ids[0]));
  }
}